

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

DescriptorNames __thiscall
google::protobuf::DescriptorBuilder::AllocateNameStrings
          (DescriptorBuilder *this,string_view scope,string_view proto_name,Message *entity,
          FlatAllocator *alloc)

{
  string_view pc;
  string_view pc_00;
  bool bVar1;
  DescriptorNames *pDVar2;
  size_t sVar3;
  char *pcVar4;
  AlphaNum *c;
  optional<google::protobuf::internal::DescriptorNames> oVar5;
  string_view local_198;
  string_view local_188;
  _Storage<google::protobuf::internal::DescriptorNames,_true> local_178;
  undefined1 local_170;
  byte local_151;
  size_t local_150;
  size_t local_148;
  AlphaNum local_140;
  AlphaNum local_110;
  char *local_e0;
  char *local_d8;
  AlphaNum local_d0;
  string local_a0;
  string_view local_80;
  size_t local_70;
  AlphaNum *local_68;
  char *local_60;
  char *local_58;
  _Storage<google::protobuf::internal::DescriptorNames,_true> local_50;
  optional<google::protobuf::internal::DescriptorNames> names;
  Message *entity_local;
  DescriptorBuilder *this_local;
  string_view proto_name_local;
  string_view scope_local;
  
  c = (AlphaNum *)proto_name._M_str;
  sVar3 = proto_name._M_len;
  pcVar4 = scope._M_str;
  local_60 = (char *)scope._M_len;
  local_70 = sVar3;
  local_68 = c;
  local_58 = pcVar4;
  names.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._8_8_ = entity;
  proto_name_local._M_len = (size_t)c;
  proto_name_local._M_str = local_60;
  oVar5 = anon_unknown_24::
          FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          ::AllocateEntityNames
                    (&alloc->
                      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                     ,scope,proto_name);
  local_50 = oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _M_payload;
  names.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_payload._0_1_ =
       oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
       _M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_50._M_value);
  if (bVar1) {
    pDVar2 = std::optional<google::protobuf::internal::DescriptorNames>::operator*
                       ((optional<google::protobuf::internal::DescriptorNames> *)&local_50._M_value)
    ;
    scope_local._M_str = pDVar2->payload_;
  }
  else {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&proto_name_local._M_str)
    ;
    local_151 = 0;
    if (bVar1) {
      local_80._M_str = (char *)proto_name_local._M_len;
      local_80._M_len = sVar3;
    }
    else {
      local_e0 = proto_name_local._M_str;
      pc_00._M_str = pcVar4;
      pc_00._M_len = (size_t)proto_name_local._M_str;
      local_d8 = pcVar4;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,pc_00);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_110,".");
      local_148 = proto_name_local._M_len;
      pc._M_str = (char *)proto_name_local._M_len;
      pc._M_len = sVar3;
      local_150 = sVar3;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_140,pc);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_a0,(lts_20250127 *)&local_d0,&local_110,&local_140,c);
      local_151 = 1;
      local_80 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a0);
    }
    AddError(this,local_80,
             (Message *)
             names.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _8_8_,NAME,"Name too long.");
    if ((local_151 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,"");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_198,"unknown");
    oVar5 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateEntityNames
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,local_188,local_198);
    local_178 = oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
                _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>
                ._M_payload;
    local_170 = oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
                _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>
                ._M_engaged;
    pDVar2 = std::optional<google::protobuf::internal::DescriptorNames>::value
                       ((optional<google::protobuf::internal::DescriptorNames> *)&local_178._M_value
                       );
    scope_local._M_str = pDVar2->payload_;
  }
  return (DescriptorNames)scope_local._M_str;
}

Assistant:

auto DescriptorBuilder::AllocateNameStrings(const absl::string_view scope,
                                            const absl::string_view proto_name,
                                            const Message& entity,
                                            internal::FlatAllocator& alloc) {
  if (auto names = alloc.AllocateEntityNames(scope, proto_name)) {
    return *names;
  }

  AddError(scope.empty() ? proto_name : absl::StrCat(scope, ".", proto_name),
           entity, DescriptorPool::ErrorCollector::NAME, "Name too long.");
  // Return any valid name for the caller to use and keep going.
  return alloc.AllocateEntityNames("", "unknown").value();
}